

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk.c
# Opt level: O0

void create_reg_file4(archive_entry *ae,char *msg)

{
  uint uVar1;
  int iVar2;
  mode_t mVar3;
  la_ssize_t v2;
  char *__file;
  undefined1 local_b0 [8];
  stat_conflict st;
  archive *ad;
  char *msg_local;
  archive_entry *ae_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'­',(uint)((archive *)st.__glibc_reserved[2] != (archive *)0x0),
                   "(ad = archive_write_disk_new()) != NULL",(void *)0x0);
  iVar2 = archive_write_header((archive *)st.__glibc_reserved[2],ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'¯',0,"0",(long)iVar2,"archive_write_header(ad, ae)",
                      (void *)st.__glibc_reserved[2]);
  v2 = archive_write_data_block
                 ((archive *)st.__glibc_reserved[2],"abcdefghijklmnopqrstuvwxyz",0x1b,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'±',0,"ARCHIVE_OK",v2,"archive_write_data_block(ad, data, sizeof(data), 0)"
                      ,(void *)0x0);
  iVar2 = archive_write_finish_entry((archive *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'²',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",
                      (void *)st.__glibc_reserved[2]);
  iVar2 = archive_write_free((archive *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'³',0,"0",(long)iVar2,"archive_write_free(ad)",(void *)0x0);
  __file = archive_entry_pathname(ae);
  iVar2 = stat(__file,(stat *)local_b0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'¶',(uint)(iVar2 == 0),"0 == stat(archive_entry_pathname(ae), &st)",
                   (void *)0x0);
  uVar1 = (uint)st.st_nlink;
  mVar3 = archive_entry_mode(ae);
  failure("st.st_mode=%o archive_entry_mode(ae)=%o",(ulong)uVar1,(ulong)mVar3);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'º',(ulong)(uint)st.st_nlink,"st.st_mode",(ulong)(mVar3 & 0xffffffed),
                      "(archive_entry_mode(ae) & ~UMASK)",(void *)0x0);
  failure("%s",msg);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'½',st.st_rdev,"st.st_size",0x1b,"sizeof(data)",(void *)0x0);
  return;
}

Assistant:

static void create_reg_file4(struct archive_entry *ae, const char *msg)
{
	static const char data[]="abcdefghijklmnopqrstuvwxyz";
	struct archive *ad;
	struct stat st;

	/* Write the entry to disk. */
	assert((ad = archive_write_disk_new()) != NULL);
	/* Leave the size unset.  The data should not be truncated. */
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_data_block(ad, data, sizeof(data), 0));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	assertEqualInt(0, archive_write_free(ad));

	/* Test the entry on disk. */
	assert(0 == stat(archive_entry_pathname(ae), &st));
	failure("st.st_mode=%o archive_entry_mode(ae)=%o",
	    st.st_mode, archive_entry_mode(ae));
#if !defined(_WIN32) || defined(__CYGWIN__)
	assertEqualInt(st.st_mode, (archive_entry_mode(ae) & ~UMASK));
#endif
	failure("%s", msg);
	assertEqualInt(st.st_size, sizeof(data));
}